

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_reader.cpp
# Opt level: O2

bool __thiscall Json::Reader::expectToken(Reader *this,TokenType type,Token *token,char *message)

{
  TokenType TVar1;
  allocator local_51;
  string local_50;
  
  readToken(this,token);
  TVar1 = token->type_;
  if (TVar1 != type) {
    std::__cxx11::string::string((string *)&local_50,message,&local_51);
    addError(this,&local_50,token,(Location)0x0);
    std::__cxx11::string::~string((string *)&local_50);
  }
  return TVar1 == type;
}

Assistant:

bool Reader::expectToken(TokenType type, Token& token, const char* message) {
  readToken(token);
  if (token.type_ != type)
    return addError(message, token);
  return true;
}